

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

uint ecc_edwards_eq(EdwardsPoint *P,EdwardsPoint *Q)

{
  EdwardsCurve *pEVar1;
  MontyContext *pMVar2;
  mp_int *pmVar3;
  uint uVar4;
  uint uVar5;
  mp_int *pmVar6;
  mp_int *pmVar7;
  
  pEVar1 = P->ec;
  if (Q->ec == pEVar1) {
    pMVar2 = pEVar1->mc;
    pmVar7 = P->Z;
    pmVar3 = Q->X;
    pmVar6 = monty_mul(pMVar2,P->X,Q->Z);
    pmVar7 = monty_mul(pMVar2,pmVar3,pmVar7);
    uVar4 = mp_cmp_eq(pmVar6,pmVar7);
    mp_free(pmVar6);
    mp_free(pmVar7);
    pMVar2 = pEVar1->mc;
    pmVar7 = P->Z;
    pmVar3 = Q->Y;
    pmVar6 = monty_mul(pMVar2,P->Y,Q->Z);
    pmVar7 = monty_mul(pMVar2,pmVar3,pmVar7);
    uVar5 = mp_cmp_eq(pmVar6,pmVar7);
    mp_free(pmVar6);
    mp_free(pmVar7);
    return uVar5 & uVar4;
  }
  __assert_fail("Q->ec == ec",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x483,"unsigned int ecc_edwards_eq(EdwardsPoint *, EdwardsPoint *)");
}

Assistant:

unsigned ecc_edwards_eq(EdwardsPoint *P, EdwardsPoint *Q)
{
    EdwardsCurve *ec = P->ec;
    assert(Q->ec == ec);

    return (projective_eq(ec->mc, P->X, P->Z, Q->X, Q->Z) &
            projective_eq(ec->mc, P->Y, P->Z, Q->Y, Q->Z));
}